

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O0

int license::CommandLineParser::parseCommandLine(int argc,char **argv)

{
  bool bVar1;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar2;
  options_description_easy_init *poVar3;
  positional_options_description *this;
  basic_command_line_parser<char> *pbVar4;
  variable_value *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type sVar5;
  size_type sVar6;
  reference pvVar7;
  typed_value<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *ptVar8;
  ostream *poVar9;
  bool local_5aa;
  bool local_599;
  invalid_argument *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  options_description local_550 [8];
  options_description license_desc;
  undefined8 local_4d0;
  undefined1 local_4c8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  project_folder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  options_description local_460 [8];
  options_description project_desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  allocator local_3b9;
  key_type local_3b8;
  undefined1 local_391;
  undefined4 local_390;
  bool verbose;
  string local_388;
  undefined1 local_368 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmds;
  undefined1 local_2d8 [8];
  parsed_options parsed;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_2a0 [144];
  positional_options_description local_210 [8];
  positional_options_description pos;
  undefined8 local_1d8;
  allocator local_1c9;
  string local_1c8 [32];
  options_description local_1a8 [8];
  options_description hidden;
  undefined8 local_128;
  allocator local_119;
  string local_118 [32];
  options_description local_f8 [8];
  options_description global;
  uint local_78;
  allocator local_71;
  int result;
  byte local_4d;
  byte local_3a;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 1) {
    printBasicHelp(*argv);
    argv_local._4_4_ = 1;
  }
  else {
    local_3a = 0;
    local_4d = 0;
    bVar1 = false;
    local_599 = false;
    if (argc == 2) {
      std::allocator<char>::allocator();
      local_3a = 1;
      std::__cxx11::string::string((string *)&local_38,"-h",&local_39);
      local_4d = 1;
      bVar1 = std::operator==(&local_38,local_18[1]);
      local_5aa = true;
      bVar1 = !bVar1;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&result,"--help",&local_71);
        local_5aa = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&result,local_18[1]);
      }
      local_599 = local_5aa;
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&result);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    if ((local_4d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_38);
    }
    if ((local_3a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    if (local_599 == false) {
      local_78 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"Global options",&local_119);
      boost::program_options::options_description::options_description(local_f8,local_118,0x50,0x28)
      ;
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      local_128 = boost::program_options::options_description::add_options(local_f8);
      boost::program_options::options_description_easy_init::operator()
                ((options_description_easy_init *)&local_128,"verbose,v","Turn on verbose output");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"Hidden options",&local_1c9);
      boost::program_options::options_description::options_description
                (local_1a8,local_1c8,0x50,0x28);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      local_1d8 = boost::program_options::options_description::add_options(local_1a8);
      ptVar2 = boost::program_options::
               value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
      poVar3 = (options_description_easy_init *)
               boost::program_options::options_description_easy_init::operator()
                         ((options_description_easy_init *)&local_1d8,"command",
                          (value_semantic *)ptVar2,
                          "command to execute: project init, project list, license list, license issue"
                         );
      ptVar2 = boost::program_options::
               value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
      boost::program_options::options_description_easy_init::operator()
                (poVar3,"subargs",(value_semantic *)ptVar2,
                 "Arguments for command, use option --help to see");
      boost::program_options::positional_options_description::positional_options_description
                (local_210);
      this = (positional_options_description *)
             boost::program_options::positional_options_description::add(local_210,"command",2);
      boost::program_options::positional_options_description::add(this,"subargs",-1);
      boost::program_options::variables_map::variables_map
                ((variables_map *)&parsed.m_options_prefix);
      boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
                ((basic_command_line_parser<char> *)
                 &cmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(int)argv_local,local_18);
      pbVar4 = boost::program_options::basic_command_line_parser<char>::options
                         ((basic_command_line_parser<char> *)
                          &cmds.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_f8);
      pbVar4 = boost::program_options::basic_command_line_parser<char>::options(pbVar4,local_1a8);
      pbVar4 = boost::program_options::basic_command_line_parser<char>::positional(pbVar4,local_210)
      ;
      pbVar4 = boost::program_options::basic_command_line_parser<char>::allow_unregistered(pbVar4);
      boost::program_options::basic_command_line_parser<char>::run
                ((basic_parsed_options<char> *)local_2d8,pbVar4);
      boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
                ((basic_command_line_parser<char> *)
                 &cmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      boost::program_options::store
                ((basic_parsed_options *)local_2d8,(variables_map *)&parsed.m_options_prefix,false);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_388,"command",(allocator *)&verbose);
      this_00 = boost::program_options::variables_map::operator[]
                          ((variables_map *)&parsed.m_options_prefix,&local_388);
      __x = boost::program_options::variable_value::
            as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_368,__x);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator((allocator<char> *)&verbose);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_368);
      if ((sVar5 == 0) ||
         (sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_368), sVar5 == 1)) {
        printBasicHelp(*local_18);
        argv_local._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3b8,"verbose",&local_3b9);
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_2a0,&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_391 = sVar6 != 0;
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_368,0);
        bVar1 = std::operator==(pvVar7,"project");
        if (bVar1) {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_368,1);
          std::__cxx11::string::substr((ulong)&local_3e0,(ulong)pvVar7);
          bVar1 = std::operator==(&local_3e0,"init");
          std::__cxx11::string::~string((string *)&local_3e0);
          if (bVar1) {
            initializeProject((parsed_options *)local_2d8,(variables_map *)&parsed.m_options_prefix,
                              local_18,local_f8);
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_368,1);
            bVar1 = std::operator==(pvVar7,"list");
            if (bVar1) {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_368,1);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&project_folder.super_type.m_storage.dummy_ + 0x18),"project ",
                             pvVar7);
              std::operator+(&local_480,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&project_folder.super_type.m_storage.dummy_ + 0x18)," options");
              boost::program_options::options_description::options_description
                        (local_460,(string *)&local_480,0x50,0x28);
              std::__cxx11::string::~string((string *)&local_480);
              std::__cxx11::string::~string
                        ((string *)(project_folder.super_type.m_storage.dummy_.data + 0x18));
              boost::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_4c8);
              local_4d0 = boost::program_options::options_description::add_options(local_460);
              ptVar8 = boost::program_options::value<boost::optional<std::__cxx11::string>>
                                 ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_4c8);
              poVar3 = (options_description_easy_init *)
                       boost::program_options::options_description_easy_init::operator()
                                 ((options_description_easy_init *)&local_4d0,"projects-folder,p",
                                  (value_semantic *)ptVar8,
                                  "path to where project configurations are stored.");
              boost::program_options::options_description_easy_init::operator()
                        (poVar3,"help","Print this help.");
              boost::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_4c8);
              boost::program_options::options_description::~options_description(local_460);
            }
            else {
              poVar9 = (ostream *)
                       std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
              poVar9 = std::operator<<(poVar9,"command ");
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_368,0);
              poVar9 = std::operator<<(poVar9,(string *)pvVar7);
              poVar9 = std::operator<<(poVar9," ");
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_368,1);
              poVar9 = std::operator<<(poVar9,(string *)pvVar7);
              std::operator<<(poVar9," not recognized.");
              printBasicHelp(*local_18);
            }
            local_78 = (uint)!bVar1;
          }
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_368,0);
          bVar1 = std::operator==(pvVar7,"license");
          if (bVar1) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_368,1);
            bVar1 = std::operator==(pvVar7,"issue");
            if (bVar1) {
              issueLicense((parsed_options *)local_2d8,(variables_map *)&parsed.m_options_prefix,
                           local_18,local_f8);
            }
            else {
              printBasicHelp(*local_18);
            }
            local_78 = (uint)!bVar1;
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_368,0);
            bVar1 = std::operator==(pvVar7,"test");
            if (bVar1) {
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_368,1);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                             ,"test ",pvVar7);
              std::operator+(&local_570,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                             ," options");
              boost::program_options::options_description::options_description
                        (local_550,(string *)&local_570,0x50,0x28);
              std::__cxx11::string::~string((string *)&local_570);
              std::__cxx11::string::~string((string *)&e);
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_368,1);
              bVar1 = std::operator==(pvVar7,"sign");
              if (bVar1) {
                test_sign((parsed_options *)local_2d8,(variables_map *)&parsed.m_options_prefix,
                          local_18,local_f8);
              }
              local_78 = (uint)!bVar1;
              boost::program_options::options_description::~options_description(local_550);
            }
            else {
              printBasicHelp(*local_18);
              local_78 = 1;
            }
          }
        }
        argv_local._4_4_ = local_78;
      }
      local_390 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_368);
      boost::program_options::basic_parsed_options<char>::~basic_parsed_options
                ((basic_parsed_options<char> *)local_2d8);
      boost::program_options::variables_map::~variables_map
                ((variables_map *)&parsed.m_options_prefix);
      boost::program_options::positional_options_description::~positional_options_description
                (local_210);
      boost::program_options::options_description::~options_description(local_1a8);
      boost::program_options::options_description::~options_description(local_f8);
    }
    else {
      printBasicHelp(*local_18);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int CommandLineParser::parseCommandLine(int argc, const char **argv) {
	if (argc == 1) {
		printBasicHelp(argv[0]);
		return 1;
	}
	if (argc == 2 && (string("-h") == argv[1] || string("--help") == argv[1])) {
		printBasicHelp(argv[0]);
		return 0;
	}
	int result = 0;
	po::options_description global("Global options");
	global.add_options()("verbose,v", "Turn on verbose output");
	po::options_description hidden("Hidden options");
	hidden.add_options()("command", po::value<std::vector<std::string>>(),
						 "command to execute: project init, project list, license list, license issue")(
		"subargs", po::value<std::vector<std::string>>(), "Arguments for command, use option --help to see");

	po::positional_options_description pos;
	pos.add("command", 2).add("subargs", -1);

	po::variables_map vm;

	po::parsed_options parsed =
		po::command_line_parser(argc, argv).options(global).options(hidden).positional(pos).allow_unregistered().run();
	po::store(parsed, vm);
	std::vector<std::string> cmds = vm["command"].as<std::vector<std::string>>();
	if (cmds.size() == 0 || cmds.size() == 1) {
		printBasicHelp(argv[0]);
		return 1;
	}
	bool verbose = vm.count("verbose") > 0;
	try {
		if (cmds[0] == "project") {
			if (cmds[1].substr(0, 4) == "init") {
				initializeProject(parsed, vm, argv, global);
			} else if (cmds[1] == "list") {
				po::options_description project_desc("project " + cmds[1] + " options");
				boost::optional<string> project_folder;
				project_desc.add_options()  //
					("projects-folder,p", po::value<boost::optional<string>>(&project_folder),
					 "path to where project configurations are stored.")  //
					("help", "Print this help.");  //

			} else {
				std::cerr << endl << "command " << cmds[0] << " " << cmds[1] << " not recognized.";
				printBasicHelp(argv[0]);
				result = 1;
			}
		} else if (cmds[0] == "license") {
			if (cmds[1] == "issue") {
				issueLicense(parsed, vm, argv, global);
			} else {
				printBasicHelp(argv[0]);
				result = 1;
			}
		} else if (cmds[0] == "test") {
			po::options_description license_desc("test " + cmds[1] + " options");
			if (cmds[1] == "sign") {
				test_sign(parsed, vm, argv, global);
			} else {
				result = 1;
			}
		} else {
			printBasicHelp(argv[0]);
			result = 1;
		}
	} catch (const invalid_argument &e) {
		printBasicHelp(argv[0]);
		cout << endl << "Parameter error: " << e.what() << endl;
		result = 1;
	}
	return result;
}